

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O1

double __thiscall
CEPlanet::EccentricAnomoly(CEPlanet *this,double *M,double *e,double *En,double *del_E)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  while( true ) {
    dVar6 = *M;
    dVar1 = *En;
    dVar2 = *e;
    dVar4 = sin(dVar1 * 0.017453292519943295);
    dVar3 = *e;
    dVar5 = cos(*En * 0.017453292519943295);
    dVar6 = (dVar6 - (dVar2 * -57.29577951308232 * dVar4 + dVar1)) / (1.0 - dVar5 * dVar3);
    *del_E = dVar6;
    if (ABS(dVar6) < this->E_tol) break;
    *En = dVar6 + *En;
  }
  return *En;
}

Assistant:

double CEPlanet::EccentricAnomoly(double& M,
                                  double& e,
                                  double& En,
                                  double& del_E) const
{
    // Note that because this method is called recursively, no
    // variables should be created inside of this method
    
    // compute del_E
    del_E = (M - (En - e*DR2D*std::sin(En*DD2R))) / (1.0-e*std::cos(En*DD2R)) ;

    // If the change is less than the tolerance, we're all good!
    if ( std::fabs(del_E) < E_tol) {
        return En ;
    }
    // If not, then do another iteration
    else {
        En += del_E ;
        return EccentricAnomoly(M, e, En, del_E) ;
    }
}